

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAT.cpp
# Opt level: O2

optional<Storage::Disk::FAT::Volume> *
Storage::Disk::FAT::GetVolume
          (optional<Storage::Disk::FAT::Volume> *__return_storage_ptr__,
          shared_ptr<Storage::Disk::Disk> *disk)

{
  byte bVar1;
  byte bVar2;
  pointer pvVar3;
  pointer puVar4;
  uchar *puVar5;
  uchar *puVar6;
  int iVar7;
  Sector *pSVar8;
  uint uVar9;
  int c;
  uint uVar10;
  long lVar11;
  size_t c_1;
  ulong uVar12;
  CHS CVar13;
  Volume local_110;
  vector<unsigned_char,_std::allocator<unsigned_char>_> root_directory;
  vector<unsigned_char,_std::allocator<unsigned_char>_> source_fat;
  Directory local_90;
  Parser parser;
  
  Encodings::MFM::Parser::Parser(&parser,Double,disk);
  pSVar8 = Encodings::MFM::Parser::sector(&parser,0,0,'\x01');
  if (((pSVar8 == (Sector *)0x0) ||
      (pvVar3 = (pSVar8->samples).
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      pvVar3 == (pSVar8->samples).
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)) ||
     ((ulong)((long)(pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start) < 0x200)) {
    (__return_storage_ptr__->super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>).
    _M_payload.super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
    super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_engaged = false;
  }
  else {
    local_110.hidden_sectors = 0;
    local_110.fat.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_110.fat.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_110.fat.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_110.root_directory.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_110.root_directory.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_110.root_directory.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    puVar4 = (pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_110.bytes_per_sector = *(uint16_t *)(puVar4 + 0xb);
    local_110.sectors_per_cluster = puVar4[0xd];
    local_110.reserved_sectors = *(uint16_t *)(puVar4 + 0xe);
    local_110.fat_copies = puVar4[0x10];
    local_110.total_sectors = *(uint16_t *)(puVar4 + 0x13);
    local_110.sectors_per_fat = *(uint16_t *)(puVar4 + 0x16);
    uVar9 = (uint)local_110.sectors_per_fat;
    local_110._12_4_ = *(undefined4 *)(puVar4 + 0x18);
    uVar10 = 0;
    local_110.correct_signature = false;
    if (puVar4[0x1fe] == 'U') {
      local_110.correct_signature = puVar4[0x1ff] == 0xaa;
    }
    iVar7 = (int)((uint)local_110.bytes_per_sector + (uint)*(ushort *)(puVar4 + 0x11) * 0x20 + -1) /
            (int)(uint)local_110.bytes_per_sector;
    local_110.first_data_sector =
         uVar9 * local_110.fat_copies + (uint)local_110.reserved_sectors + iVar7;
    source_fat.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    source_fat.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    source_fat.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (; uVar10 < uVar9; uVar10 = uVar10 + 1) {
      CVar13 = Volume::chs_for_sector(&local_110,local_110.reserved_sectors + uVar10);
      pSVar8 = Encodings::MFM::Parser::sector
                         (&parser,CVar13.head,CVar13.cylinder,(uint8_t)CVar13.sector);
      if ((pSVar8 == (Sector *)0x0) ||
         (pvVar3 = (pSVar8->samples).
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         pvVar3 == (pSVar8->samples).
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)) {
LAB_003e3391:
        (__return_storage_ptr__->super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>).
        _M_payload.super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
        super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_engaged = false;
        goto LAB_003e34df;
      }
      puVar5 = (pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = (pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((long)puVar6 - (long)puVar5 != (ulong)local_110.bytes_per_sector) goto LAB_003e3391;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (puVar5,puVar6,&source_fat);
      uVar9 = (uint)local_110.sectors_per_fat;
    }
    for (uVar12 = 0;
        uVar12 < (ulong)((long)source_fat.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)source_fat.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start); uVar12 = uVar12 + 3) {
      bVar1 = source_fat.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12 + 1];
      bVar2 = source_fat.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12 + 2];
      root_directory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(CONCAT62(root_directory.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._2_6_,
                              CONCAT11(bVar1,source_fat.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar12])) &
                    0xffffffffffff0fff);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                (&local_110.fat,(unsigned_short *)&root_directory);
      root_directory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT62(root_directory.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._2_6_,
                             (short)(((uint)bVar2 << 0x10 | (uint)bVar1 << 8) >> 0xc));
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                (&local_110.fat,(unsigned_short *)&root_directory);
    }
    root_directory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    root_directory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    root_directory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (lVar11 = 0; iVar7 != lVar11; lVar11 = lVar11 + 1) {
      CVar13 = Volume::chs_for_sector
                         (&local_110,
                          (uint)local_110.reserved_sectors + (int)lVar11 +
                          (uint)local_110.fat_copies * (uint)local_110.sectors_per_fat);
      pSVar8 = Encodings::MFM::Parser::sector
                         (&parser,CVar13.head,CVar13.cylinder,(uint8_t)CVar13.sector);
      if ((pSVar8 == (Sector *)0x0) ||
         (pvVar3 = (pSVar8->samples).
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         pvVar3 == (pSVar8->samples).
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)) {
LAB_003e3493:
        (__return_storage_ptr__->super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>).
        _M_payload.super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
        super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_engaged = false;
        goto LAB_003e34d5;
      }
      puVar5 = (pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = (pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((long)puVar6 - (long)puVar5 != (ulong)local_110.bytes_per_sector) goto LAB_003e3493;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (puVar5,puVar6,&root_directory);
    }
    anon_unknown.dwarf_1122729::directory_from(&local_90,&root_directory);
    std::vector<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>::_M_move_assign
              (&local_110.root_directory,&local_90);
    std::vector<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>::~vector
              (&local_90);
    std::optional<Storage::Disk::FAT::Volume>::optional<Storage::Disk::FAT::Volume,_true>
              (__return_storage_ptr__,&local_110);
LAB_003e34d5:
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&root_directory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
LAB_003e34df:
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&source_fat.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    Volume::~Volume(&local_110);
  }
  Encodings::MFM::Parser::~Parser(&parser);
  return __return_storage_ptr__;
}

Assistant:

std::optional<FAT::Volume> FAT::GetVolume(const std::shared_ptr<Storage::Disk::Disk> &disk) {
	Storage::Encodings::MFM::Parser parser(Storage::Encodings::MFM::Density::Double, disk);

	// Grab the boot sector; that'll be enough to establish the volume.
	const Storage::Encodings::MFM::Sector *const boot_sector = parser.sector(0, 0, 1);
	if(!boot_sector || boot_sector->samples.empty() || boot_sector->samples[0].size() < 512) {
		return std::nullopt;
	}

	// Obtain volume details.
	const auto &data = boot_sector->samples[0];
	FAT::Volume volume;
	volume.bytes_per_sector = uint16_t(data[11] | (data[12] << 8));
	volume.sectors_per_cluster = data[13];
	volume.reserved_sectors = uint16_t(data[14] | (data[15] << 8));
	volume.fat_copies = data[16];
	const uint16_t root_directory_entries = uint16_t(data[17] | (data[18] << 8));
	volume.total_sectors = uint16_t(data[19] | (data[20] << 8));
	volume.sectors_per_fat = uint16_t(data[22] | (data[23] << 8));
	volume.sectors_per_track = uint16_t(data[24] | (data[25] << 8));
	volume.head_count = uint16_t(data[26] | (data[27] << 8));
	volume.correct_signature = data[510] == 0x55 && data[511] == 0xaa;

	const size_t root_directory_sectors = (root_directory_entries*32 + volume.bytes_per_sector - 1) / volume.bytes_per_sector;
	volume.first_data_sector = int(volume.reserved_sectors + volume.sectors_per_fat*volume.fat_copies + root_directory_sectors);

	// Grab the FAT.
	std::vector<uint8_t> source_fat;
	for(int c = 0; c < volume.sectors_per_fat; c++) {
		const int sector_number = volume.reserved_sectors + c;
		const auto address = volume.chs_for_sector(sector_number);

		const Storage::Encodings::MFM::Sector *const fat_sector =
			parser.sector(address.head, address.cylinder, uint8_t(address.sector));
		if(!fat_sector || fat_sector->samples.empty() || fat_sector->samples[0].size() != volume.bytes_per_sector) {
			return std::nullopt;
		}
		std::copy(fat_sector->samples[0].begin(), fat_sector->samples[0].end(), std::back_inserter(source_fat));
	}

	// Decode the FAT.
	// TODO: stop assuming FAT12 here.
	for(size_t c = 0; c < source_fat.size(); c += 3) {
		const uint32_t double_cluster = uint32_t(source_fat[c] + (source_fat[c + 1] << 8) + (source_fat[c + 2] << 16));
		volume.fat.push_back(uint16_t(double_cluster & 0xfff));
		volume.fat.push_back(uint16_t(double_cluster >> 12));
	}

	// Grab the root directory.
	std::vector<uint8_t> root_directory;
	for(size_t c = 0; c < root_directory_sectors; c++) {
		const auto sector_number = int(volume.reserved_sectors + c + volume.sectors_per_fat*volume.fat_copies);
		const auto address = volume.chs_for_sector(sector_number);

		const Storage::Encodings::MFM::Sector *const sector =
			parser.sector(address.head, address.cylinder, uint8_t(address.sector));
		if(!sector || sector->samples.empty() || sector->samples[0].size() != volume.bytes_per_sector) {
			return std::nullopt;
		}
		std::copy(sector->samples[0].begin(), sector->samples[0].end(), std::back_inserter(root_directory));
	}
	volume.root_directory = directory_from(root_directory);

	return volume;
}